

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderRead(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlParserCtxtPtr pxVar2;
  xmlNodePtr pxVar3;
  xmlNodePtr *ppxVar4;
  xmlChar *str;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlParserErrors code;
  xmlNodePtr pxVar9;
  xmlXIncludeCtxtPtr ctxt;
  uint uVar10;
  _xmlNode *p_Var11;
  _xmlNode *p_Var12;
  xmlTextReaderState xVar13;
  xmlNodePtr cur;
  long lVar14;
  xmlNodePtr tmp;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  xVar13 = reader->state;
  if (xVar13 == XML_TEXTREADER_ERROR) {
    return -1;
  }
  reader->curnode = (xmlNodePtr)0x0;
  if (reader->doc != (xmlDocPtr)0x0) {
    if (xVar13 == XML_TEXTREADER_END) {
      return 0;
    }
    p_Var11 = reader->node;
    do {
      if (p_Var11 == (_xmlNode *)0x0) {
        p_Var12 = reader->doc->children;
        if (p_Var12 == (_xmlNode *)0x0) goto LAB_00176114;
LAB_0017609c:
        reader->node = p_Var12;
LAB_001760a0:
        xVar13 = XML_TEXTREADER_START;
        p_Var11 = p_Var12;
      }
      else if ((xVar13 == XML_TEXTREADER_BACKTRACK) ||
              ((xVar1 = p_Var11->type, xVar1 < XML_XINCLUDE_END &&
               ((0x84020U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
LAB_00176060:
        p_Var12 = p_Var11->next;
        if (p_Var12 != (_xmlNode *)0x0) goto LAB_0017609c;
        p_Var12 = p_Var11->parent;
        if (p_Var12 == (_xmlNode *)0x0) {
          xVar13 = XML_TEXTREADER_END;
        }
        else {
          if ((p_Var12->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) {
LAB_00176114:
            reader->state = XML_TEXTREADER_END;
            return 0;
          }
          reader->node = p_Var12;
          reader->depth = reader->depth + -1;
          xVar13 = XML_TEXTREADER_BACKTRACK;
          p_Var11 = p_Var12;
        }
      }
      else {
        p_Var12 = p_Var11->children;
        if (p_Var12 != (_xmlNode *)0x0) {
          reader->node = p_Var12;
          reader->depth = reader->depth + 1;
          goto LAB_001760a0;
        }
        xVar13 = XML_TEXTREADER_BACKTRACK;
        if (xVar1 != XML_ATTRIBUTE_NODE) goto LAB_00176060;
      }
      reader->state = xVar13;
      if (1 < p_Var11->type - XML_XINCLUDE_START) {
        return 1;
      }
    } while( true );
  }
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  if (reader->mode != 0) {
    iVar8 = reader->ctxt->nodeNr;
    pxVar9 = reader->node;
    cur = pxVar9;
    goto LAB_001761ba;
  }
  reader->mode = 1;
  do {
    iVar8 = xmlTextReaderPushData(reader);
    if (iVar8 < 0) goto LAB_001761ca;
    pxVar2 = reader->ctxt;
    if (pxVar2->node != (xmlNodePtr)0x0) {
      if (pxVar2->myDoc == (xmlDocPtr)0x0) {
        p_Var11 = reader->node;
      }
      else {
        p_Var11 = pxVar2->myDoc->children;
        reader->node = p_Var11;
      }
      if (p_Var11 == (_xmlNode *)0x0) {
        reader->node = *pxVar2->nodeTab;
      }
      goto LAB_00176191;
    }
  } while ((reader->mode != 3) && (reader->state != XML_TEXTREADER_DONE));
  if (pxVar2->myDoc == (xmlDocPtr)0x0) {
    p_Var11 = reader->node;
  }
  else {
    p_Var11 = pxVar2->myDoc->children;
    reader->node = p_Var11;
  }
  if (p_Var11 == (_xmlNode *)0x0) {
LAB_001761ca:
    reader->mode = 2;
    reader->state = XML_TEXTREADER_ERROR;
    return -1;
  }
LAB_00176191:
  reader->state = XML_TEXTREADER_ELEMENT;
  reader->depth = 0;
  pxVar2->parseMode = XML_PARSE_READER;
  cur = (xmlNodePtr)0x0;
  xVar13 = XML_TEXTREADER_START;
  iVar8 = 0;
LAB_0017646a:
  do {
    pxVar9 = reader->node;
    if ((((pxVar9 != (xmlNodePtr)0x0) && (pxVar9->next == (_xmlNode *)0x0)) &&
        (pxVar9->type - XML_TEXT_NODE < 2)) &&
       (pxVar9 = xmlTextReaderExpand(reader), pxVar9 == (xmlNodePtr)0x0)) {
      return -1;
    }
    if (((reader->xinclude != 0) && (reader->in_xinclude == 0)) &&
       (reader->state != XML_TEXTREADER_BACKTRACK)) {
      pxVar9 = reader->node;
      if (pxVar9 == (xmlNodePtr)0x0) {
LAB_0017671f:
        if (((reader->patternNr < 1) || (reader->state == XML_TEXTREADER_END)) ||
           (reader->state == XML_TEXTREADER_BACKTRACK)) goto LAB_0017688c;
        lVar14 = 0;
        break;
      }
      if (((pxVar9->type == XML_ELEMENT_NODE) && (pxVar9->ns != (xmlNs *)0x0)) &&
         ((iVar6 = xmlStrEqual(pxVar9->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
          iVar6 != 0 ||
          (iVar6 = xmlStrEqual(reader->node->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
          iVar6 != 0)))) {
        if (reader->xincctxt == (xmlXIncludeCtxtPtr)0x0) {
          ctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
          reader->xincctxt = ctxt;
          if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
            xmlTextReaderErrMemory(reader);
            return -1;
          }
          xmlXIncludeSetFlags(ctxt,reader->parserFlags & 0xffff7fff);
          xmlXIncludeSetStreamingMode(reader->xincctxt,1);
          if ((reader->errorFunc != (xmlTextReaderErrorFunc)0x0) ||
             (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0)) {
            xmlXIncludeSetErrorHandler(reader->xincctxt,xmlTextReaderStructuredRelay,reader);
          }
          if (reader->resourceLoader != (xmlResourceLoader)0x0) {
            xmlXIncludeSetResourceLoader
                      (reader->xincctxt,reader->resourceLoader,reader->resourceCtxt);
          }
        }
        pxVar9 = xmlTextReaderExpand(reader);
        if (pxVar9 == (xmlNodePtr)0x0) {
          return -1;
        }
        iVar6 = xmlXIncludeProcessNode(reader->xincctxt,reader->node);
        if (-1 < iVar6) goto LAB_001765d3;
        code = xmlXIncludeGetLastError(reader->xincctxt);
        iVar8 = xmlIsCatastrophicError(3,code);
        if (iVar8 == 0) {
          return -1;
        }
        xmlFatalErr(reader->ctxt,code,(char *)0x0);
        goto LAB_0017679c;
      }
    }
LAB_001765d3:
    pxVar9 = reader->node;
    if (pxVar9 == (xmlNodePtr)0x0) goto LAB_0017671f;
    xVar1 = pxVar9->type;
    if (xVar1 == XML_ENTITY_REF_NODE) {
      if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
LAB_0017667c:
        if (((pxVar9->type != XML_ENTITY_DECL) || (reader->ent == (xmlNodePtr)0x0)) ||
           (reader->ent->children != pxVar9)) {
          if (reader->validate != XML_TEXTREADER_NOT_VALIDATE) {
            if (pxVar9->type == XML_ELEMENT_NODE) {
              if (((reader->state != XML_TEXTREADER_END) &&
                  (reader->state != XML_TEXTREADER_BACKTRACK)) &&
                 (iVar8 = xmlTextReaderValidatePush(reader), iVar8 < 0)) {
                return -1;
              }
            }
            else if (pxVar9->type - XML_TEXT_NODE < 2) {
              str = pxVar9->content;
              iVar8 = xmlStrlen(str);
              xmlTextReaderValidateCData(reader,str,iVar8);
            }
          }
          goto LAB_0017671f;
        }
        iVar6 = reader->entNr;
        pxVar9 = (xmlNodePtr)0x0;
        if (0 < (long)iVar6) {
          uVar10 = iVar6 - 1;
          reader->entNr = uVar10;
          pxVar9 = (xmlNodePtr)0x0;
          ppxVar4 = reader->entTab;
          if (iVar6 != 1) {
            pxVar9 = ppxVar4[(long)iVar6 + -2];
          }
          reader->ent = pxVar9;
          pxVar9 = ppxVar4[uVar10];
          ppxVar4[uVar10] = (xmlNodePtr)0x0;
        }
        reader->node = pxVar9;
        reader->depth = reader->depth + 1;
      }
      else {
        if (reader->ctxt->replaceEntities != 1) {
          if ((reader->ctxt != (xmlParserCtxtPtr)0x0) &&
             (reader->validate != XML_TEXTREADER_NOT_VALIDATE)) {
            iVar6 = xmlTextReaderValidateEntity(reader);
            if (iVar6 < 0) {
              return -1;
            }
            pxVar9 = reader->node;
LAB_00176673:
            if (pxVar9 == (xmlNodePtr)0x0) goto LAB_0017671f;
          }
          goto LAB_0017667c;
        }
        p_Var11 = pxVar9->children;
        if (((p_Var11 == (_xmlNode *)0x0) || (p_Var11->type != XML_ENTITY_DECL)) ||
           (p_Var11->children == (_xmlNode *)0x0)) goto LAB_0017667c;
        iVar6 = xmlTextReaderEntPush(reader,pxVar9);
        pxVar9 = reader->node;
        if (-1 < iVar6) {
          pxVar9 = pxVar9->children->children;
          reader->node = pxVar9;
          goto LAB_00176673;
        }
      }
LAB_001761ba:
      if (pxVar9 == (xmlNodePtr)0x0) {
        if (reader->mode == 3) {
          return 0;
        }
        goto LAB_001761ca;
      }
    }
    else {
      iVar6 = 1;
      if (xVar1 != XML_XINCLUDE_START) {
        if (xVar1 != XML_XINCLUDE_END) goto LAB_0017667c;
        iVar6 = -1;
      }
      reader->in_xinclude = reader->in_xinclude + iVar6;
    }
    while (pxVar9->next == (_xmlNode *)0x0) {
      pxVar2 = reader->ctxt;
      if (pxVar2->nodeNr != iVar8) {
LAB_00176282:
        if (xVar13 != XML_TEXTREADER_BACKTRACK) goto LAB_00176298;
        goto LAB_001763d1;
      }
      if ((((xVar13 != XML_TEXTREADER_BACKTRACK) &&
           (p_Var11 = pxVar9->children, p_Var11 != (_xmlNode *)0x0)) &&
          ((xVar1 = pxVar9->type, xVar1 != XML_ENTITY_REF_NODE &&
           ((p_Var11->type != XML_TEXT_NODE || (p_Var11->next != (_xmlNode *)0x0)))))) &&
         ((XML_DTD_NODE < xVar1 ||
          ((0x6200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0))))
      goto LAB_001762a3;
      pxVar3 = pxVar2->node;
      if ((((pxVar3 != (xmlNodePtr)0x0) && (pxVar3 != pxVar9)) && (pxVar3 != pxVar9->parent)) ||
         ((pxVar2->instate == XML_PARSER_EOF || (1 < pxVar2->disableSAX)))) goto LAB_00176282;
      iVar6 = xmlTextReaderPushData(reader);
      if (iVar6 < 0) goto LAB_0017679c;
      pxVar9 = reader->node;
      if (pxVar9 == (xmlNodePtr)0x0) goto LAB_00176274;
    }
    if (xVar13 != XML_TEXTREADER_BACKTRACK) {
LAB_00176298:
      p_Var11 = pxVar9->children;
      bVar5 = false;
      if (p_Var11 != (_xmlNode *)0x0) {
LAB_001762a3:
        if ((pxVar9->type < XML_XINCLUDE_END) &&
           (bVar5 = true,
           (0x84020U >> (pxVar9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0))
        goto LAB_001762c1;
        reader->node = p_Var11;
        reader->depth = reader->depth + 1;
LAB_00176463:
        reader->state = XML_TEXTREADER_ELEMENT;
        goto LAB_0017646a;
      }
LAB_001762c1:
      if (pxVar9->next == (_xmlNode *)0x0) {
        if (((xVar13 != XML_TEXTREADER_ELEMENT) || (pxVar9->type != XML_ELEMENT_NODE || bVar5)) ||
           ((pxVar9->extra & 1) != 0)) {
LAB_001763d1:
          if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
             (pxVar9->type == XML_ELEMENT_NODE)) {
            iVar6 = xmlTextReaderValidatePop(reader);
            if (iVar6 < 0) {
              return -1;
            }
            pxVar9 = reader->node;
          }
          iVar6 = reader->preserves;
          iVar7 = iVar6;
          if ((0 < iVar6) && (iVar7 = 1, (pxVar9->extra & 4) != 0)) {
            iVar7 = iVar6 + -1;
            reader->preserves = iVar7;
          }
          p_Var11 = pxVar9->parent;
          reader->node = p_Var11;
          if ((p_Var11 == (_xmlNode *)0x0) ||
             ((p_Var11->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE)) {
            if (reader->mode != 3) {
              iVar8 = xmlParseChunk(reader->ctxt,"",0,1);
              reader->state = XML_TEXTREADER_DONE;
              if (iVar8 != 0) {
LAB_0017679c:
                reader->mode = 2;
                reader->state = XML_TEXTREADER_ERROR;
                return -1;
              }
            }
            reader->node = (xmlNodePtr)0x0;
            reader->depth = -1;
            if (((((cur != (xmlNodePtr)0x0) && (reader->preserves == 0)) &&
                 (reader->in_xinclude == 0)) &&
                ((reader->entNr == 0 && (cur->type != XML_DTD_NODE)))) && ((cur->extra & 2) == 0)) {
              xmlUnlinkNode(cur);
              xmlTextReaderFreeNode(reader,cur);
            }
LAB_00176274:
            reader->state = XML_TEXTREADER_DONE;
            return 0;
          }
          if (((iVar7 == 0) && (reader->in_xinclude == 0)) &&
             ((reader->entNr == 0 &&
              ((pxVar9 = p_Var11->last, pxVar9 != (xmlNodePtr)0x0 && ((pxVar9->extra & 2) == 0))))))
          {
            xmlUnlinkNode(pxVar9);
            xmlTextReaderFreeNode(reader,pxVar9);
          }
          reader->depth = reader->depth + -1;
          reader->state = XML_TEXTREADER_BACKTRACK;
          goto LAB_0017646a;
        }
      }
      else if ((((xVar13 != XML_TEXTREADER_ELEMENT) || (pxVar9->type != XML_ELEMENT_NODE || bVar5))
               || ((pxVar9->extra & 1) != 0)) || (0 < reader->in_xinclude)) goto LAB_001762ee;
      reader->state = XML_TEXTREADER_END;
      xVar13 = XML_TEXTREADER_ELEMENT;
      goto LAB_0017646a;
    }
LAB_001762ee:
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (pxVar9->type == XML_ELEMENT_NODE)) {
      iVar6 = xmlTextReaderValidatePop(reader);
      if (iVar6 < 0) {
        return -1;
      }
      pxVar9 = reader->node;
    }
    iVar6 = reader->preserves;
    if (0 < iVar6) {
      if ((pxVar9->extra & 4) == 0) {
        reader->node = pxVar9->next;
        goto LAB_00176463;
      }
      iVar6 = iVar6 + -1;
      reader->preserves = iVar6;
    }
    p_Var11 = pxVar9->next;
    reader->node = p_Var11;
    reader->state = XML_TEXTREADER_ELEMENT;
    if (((iVar6 == 0) && (reader->in_xinclude == 0)) &&
       ((reader->entNr == 0 &&
        (((pxVar9 = p_Var11->prev, pxVar9 != (xmlNodePtr)0x0 && (pxVar9->type != XML_DTD_NODE)) &&
         ((pxVar9->extra & 2) == 0)))))) {
      if (cur == pxVar9) {
        cur = (xmlNodePtr)0x0;
      }
      xmlUnlinkNode(pxVar9);
      xmlTextReaderFreeNode(reader,pxVar9);
    }
  } while( true );
  while (lVar14 = lVar14 + 1, lVar14 < reader->patternNr) {
    iVar8 = xmlPatternMatch(reader->patternTab[lVar14],reader->node);
    if (iVar8 == 1) {
      xmlTextReaderPreserve(reader);
      break;
    }
  }
LAB_0017688c:
  if (((reader->validate == XML_TEXTREADER_VALIDATE_XSD) && (reader->xsdValidErrors == 0)) &&
     (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0)) {
    iVar8 = xmlSchemaIsValid(reader->xsdValidCtxt);
    reader->xsdValidErrors = (uint)(iVar8 == 0);
  }
  return 1;
}

Assistant:

int
xmlTextReaderRead(xmlTextReaderPtr reader) {
    int val, olddepth = 0;
    xmlTextReaderState oldstate = XML_TEXTREADER_START;
    xmlNodePtr oldnode = NULL;

    if (reader == NULL)
	return(-1);
    if (reader->state == XML_TEXTREADER_ERROR)
        return(-1);

    reader->curnode = NULL;
    if (reader->doc != NULL)
        return(xmlTextReaderReadTree(reader));
    if (reader->ctxt == NULL)
	return(-1);

    if (reader->mode == XML_TEXTREADER_MODE_INITIAL) {
	reader->mode = XML_TEXTREADER_MODE_INTERACTIVE;
	/*
	 * Initial state
	 */
	do {
	    val = xmlTextReaderPushData(reader);
            if (val < 0) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
                return(-1);
            }
	} while ((reader->ctxt->node == NULL) &&
		 ((reader->mode != XML_TEXTREADER_MODE_EOF) &&
		  (reader->state != XML_TEXTREADER_DONE)));
	if (reader->ctxt->node == NULL) {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
		return(-1);
	    }
	    reader->state = XML_TEXTREADER_ELEMENT;
	} else {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL)
		reader->node = reader->ctxt->nodeTab[0];
	    reader->state = XML_TEXTREADER_ELEMENT;
	}
	reader->depth = 0;
	reader->ctxt->parseMode = XML_PARSE_READER;
	goto node_found;
    }
    oldstate = reader->state;
    olddepth = reader->ctxt->nodeNr;
    oldnode = reader->node;

get_next_node:
    if (reader->node == NULL) {
	if (reader->mode == XML_TEXTREADER_MODE_EOF) {
	    return(0);
        } else {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
        }
    }

    /*
     * If we are not backtracking on ancestors or examined nodes,
     * that the parser didn't finished or that we aren't at the end
     * of stream, continue processing.
     */
    while ((reader->node != NULL) && (reader->node->next == NULL) &&
	   (reader->ctxt->nodeNr == olddepth) &&
           ((oldstate == XML_TEXTREADER_BACKTRACK) ||
            (reader->node->children == NULL) ||
	    (reader->node->type == XML_ENTITY_REF_NODE) ||
	    ((reader->node->children != NULL) &&
	     (reader->node->children->type == XML_TEXT_NODE) &&
	     (reader->node->children->next == NULL)) ||
	    (reader->node->type == XML_DTD_NODE) ||
	    (reader->node->type == XML_DOCUMENT_NODE) ||
	    (reader->node->type == XML_HTML_DOCUMENT_NODE)) &&
	   ((reader->ctxt->node == NULL) ||
	    (reader->ctxt->node == reader->node) ||
	    (reader->ctxt->node == reader->node->parent)) &&
	   (reader->ctxt->instate != XML_PARSER_EOF) &&
	   (PARSER_STOPPED(reader->ctxt) == 0)) {
	val = xmlTextReaderPushData(reader);
	if (val < 0) {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
        }
	if (reader->node == NULL)
	    goto node_end;
    }
    if (oldstate != XML_TEXTREADER_BACKTRACK) {
	if ((reader->node->children != NULL) &&
	    (reader->node->type != XML_ENTITY_REF_NODE) &&
	    (reader->node->type != XML_XINCLUDE_START) &&
	    (reader->node->type != XML_DTD_NODE)) {
	    reader->node = reader->node->children;
	    reader->depth++;
	    reader->state = XML_TEXTREADER_ELEMENT;
	    goto node_found;
	}
    }
    if (reader->node->next != NULL) {
	if ((oldstate == XML_TEXTREADER_ELEMENT) &&
            (reader->node->type == XML_ELEMENT_NODE) &&
	    (reader->node->children == NULL) &&
	    ((reader->node->extra & NODE_IS_EMPTY) == 0)
#ifdef LIBXML_XINCLUDE_ENABLED
	    && (reader->in_xinclude <= 0)
#endif
	    ) {
	    reader->state = XML_TEXTREADER_END;
	    goto node_found;
	}
#ifdef LIBXML_REGEXP_ENABLED
	if ((reader->validate) &&
	    (reader->node->type == XML_ELEMENT_NODE))
	    if (xmlTextReaderValidatePop(reader) < 0)
                return(-1);
#endif /* LIBXML_REGEXP_ENABLED */
        if ((reader->preserves > 0) &&
	    (reader->node->extra & NODE_IS_SPRESERVED))
	    reader->preserves--;
	reader->node = reader->node->next;
	reader->state = XML_TEXTREADER_ELEMENT;

	/*
	 * Cleanup of the old node
	 */
	if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (reader->node->prev != NULL) &&
            (reader->node->prev->type != XML_DTD_NODE)) {
	    xmlNodePtr tmp = reader->node->prev;
	    if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
                if (oldnode == tmp)
                    oldnode = NULL;
		xmlUnlinkNode(tmp);
		xmlTextReaderFreeNode(reader, tmp);
	    }
	}

	goto node_found;
    }
    if ((oldstate == XML_TEXTREADER_ELEMENT) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->children == NULL) &&
	((reader->node->extra & NODE_IS_EMPTY) == 0)) {;
	reader->state = XML_TEXTREADER_END;
	goto node_found;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
        (reader->node->type == XML_ELEMENT_NODE)) {
        if (xmlTextReaderValidatePop(reader) < 0)
            return(-1);
    }
#endif /* LIBXML_REGEXP_ENABLED */
    if ((reader->preserves > 0) &&
	(reader->node->extra & NODE_IS_SPRESERVED))
	reader->preserves--;
    reader->node = reader->node->parent;
    if ((reader->node == NULL) ||
	(reader->node->type == XML_DOCUMENT_NODE) ||
	(reader->node->type == XML_HTML_DOCUMENT_NODE)) {
	if (reader->mode != XML_TEXTREADER_MODE_EOF) {
	    val = xmlParseChunk(reader->ctxt, "", 0, 1);
	    reader->state = XML_TEXTREADER_DONE;
	    if (val != 0) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
	        return(-1);
            }
	}
	reader->node = NULL;
	reader->depth = -1;

	/*
	 * Cleanup of the old node
	 */
	if ((oldnode != NULL) && (reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (oldnode->type != XML_DTD_NODE) &&
	    ((oldnode->extra & NODE_IS_PRESERVED) == 0)) {
	    xmlUnlinkNode(oldnode);
	    xmlTextReaderFreeNode(reader, oldnode);
	}

	goto node_end;
    }
    if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
        (reader->in_xinclude == 0) &&
#endif
	(reader->entNr == 0) &&
        (reader->node->last != NULL) &&
        ((reader->node->last->extra & NODE_IS_PRESERVED) == 0)) {
	xmlNodePtr tmp = reader->node->last;
	xmlUnlinkNode(tmp);
	xmlTextReaderFreeNode(reader, tmp);
    }
    reader->depth--;
    reader->state = XML_TEXTREADER_BACKTRACK;

node_found:
    /*
     * If we are in the middle of a piece of CDATA make sure it's finished
     */
    if ((reader->node != NULL) &&
        (reader->node->next == NULL) &&
        ((reader->node->type == XML_TEXT_NODE) ||
	 (reader->node->type == XML_CDATA_SECTION_NODE))) {
            if (xmlTextReaderExpand(reader) == NULL)
	        return -1;
    }

#ifdef LIBXML_XINCLUDE_ENABLED
    /*
     * Handle XInclude if asked for
     */
    if ((reader->xinclude) && (reader->in_xinclude == 0) &&
        (reader->state != XML_TEXTREADER_BACKTRACK) &&
        (reader->node != NULL) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->ns != NULL) &&
	((xmlStrEqual(reader->node->ns->href, XINCLUDE_NS)) ||
	 (xmlStrEqual(reader->node->ns->href, XINCLUDE_OLD_NS)))) {
	if (reader->xincctxt == NULL) {
	    reader->xincctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
            if (reader->xincctxt == NULL) {
                xmlTextReaderErrMemory(reader);
                return(-1);
            }
	    xmlXIncludeSetFlags(reader->xincctxt,
	                        reader->parserFlags & (~XML_PARSE_NOXINCNODE));
            xmlXIncludeSetStreamingMode(reader->xincctxt, 1);
            if ((reader->errorFunc != NULL) || (reader->sErrorFunc != NULL))
                xmlXIncludeSetErrorHandler(reader->xincctxt,
                        xmlTextReaderStructuredRelay, reader);
            if (reader->resourceLoader != NULL)
                xmlXIncludeSetResourceLoader(reader->xincctxt,
                        reader->resourceLoader, reader->resourceCtxt);
	}
	/*
	 * expand that node and process it
	 */
	if (xmlTextReaderExpand(reader) == NULL)
	    return(-1);
        if (xmlXIncludeProcessNode(reader->xincctxt, reader->node) < 0) {
            int err = xmlXIncludeGetLastError(reader->xincctxt);

            if (xmlIsCatastrophicError(XML_ERR_FATAL, err)) {
                xmlFatalErr(reader->ctxt, err, NULL);
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
            }
            return(-1);
        }
    }
    if ((reader->node != NULL) && (reader->node->type == XML_XINCLUDE_START)) {
        reader->in_xinclude++;
	goto get_next_node;
    }
    if ((reader->node != NULL) && (reader->node->type == XML_XINCLUDE_END)) {
        reader->in_xinclude--;
	goto get_next_node;
    }
#endif
    /*
     * Handle entities enter and exit when in entity replacement mode
     */
    if ((reader->node != NULL) &&
	(reader->node->type == XML_ENTITY_REF_NODE) &&
	(reader->ctxt != NULL) && (reader->ctxt->replaceEntities == 1)) {
	if ((reader->node->children != NULL) &&
	    (reader->node->children->type == XML_ENTITY_DECL) &&
	    (reader->node->children->children != NULL)) {
	    if (xmlTextReaderEntPush(reader, reader->node) < 0)
                goto get_next_node;
	    reader->node = reader->node->children->children;
	}
#ifdef LIBXML_REGEXP_ENABLED
    } else if ((reader->node != NULL) &&
	       (reader->node->type == XML_ENTITY_REF_NODE) &&
	       (reader->ctxt != NULL) && (reader->validate)) {
	if (xmlTextReaderValidateEntity(reader) < 0)
            return(-1);
#endif /* LIBXML_REGEXP_ENABLED */
    }
    if ((reader->node != NULL) &&
	(reader->node->type == XML_ENTITY_DECL) &&
	(reader->ent != NULL) && (reader->ent->children == reader->node)) {
	reader->node = xmlTextReaderEntPop(reader);
	reader->depth++;
        goto get_next_node;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (reader->node != NULL)) {
	xmlNodePtr node = reader->node;

	if ((node->type == XML_ELEMENT_NODE) &&
            ((reader->state != XML_TEXTREADER_END) &&
	     (reader->state != XML_TEXTREADER_BACKTRACK))) {
	    if (xmlTextReaderValidatePush(reader) < 0)
                return(-1);
	} else if ((node->type == XML_TEXT_NODE) ||
		   (node->type == XML_CDATA_SECTION_NODE)) {
            xmlTextReaderValidateCData(reader, node->content,
	                               xmlStrlen(node->content));
	}
    }
#endif /* LIBXML_REGEXP_ENABLED */
#ifdef LIBXML_PATTERN_ENABLED
    if ((reader->patternNr > 0) && (reader->state != XML_TEXTREADER_END) &&
        (reader->state != XML_TEXTREADER_BACKTRACK)) {
        int i;
	for (i = 0;i < reader->patternNr;i++) {
	     if (xmlPatternMatch(reader->patternTab[i], reader->node) == 1) {
	         xmlTextReaderPreserve(reader);
		 break;
             }
	}
    }
#endif /* LIBXML_PATTERN_ENABLED */
#ifdef LIBXML_SCHEMAS_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_XSD) &&
        (reader->xsdValidErrors == 0) &&
	(reader->xsdValidCtxt != NULL)) {
	reader->xsdValidErrors = !xmlSchemaIsValid(reader->xsdValidCtxt);
    }
#endif /* LIBXML_PATTERN_ENABLED */
    return(1);
node_end:
    reader->state = XML_TEXTREADER_DONE;
    return(0);
}